

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::ostream_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *func;
  string *name;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffdf0;
  allocator *paVar2;
  string *in_stack_fffffffffffffdf8;
  name_space *in_stack_fffffffffffffe00;
  name_space *this;
  undefined8 in_stack_fffffffffffffe20;
  undefined1 uVar3;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr__Ios_Seekdir_numeric_ptr
  *in_stack_fffffffffffffe28;
  allocator local_181;
  string local_180 [47];
  undefined1 local_151 [48];
  allocator local_121;
  string local_120 [47];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [47];
  allocator local_91;
  string local_90 [47];
  allocator local_61;
  string local_60 [63];
  allocator local_21;
  string local_20 [32];
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe20 >> 0x38);
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffdf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"put",&local_21);
  cs::make_cni<void(&)(std::shared_ptr<std::ostream>&,char)>
            ((_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char *)
             in_stack_fffffffffffffe28,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(var *)in_stack_fffffffffffffdf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"tell",&local_61);
  cs::make_cni<cs::numeric(&)(std::shared_ptr<std::ostream>&)>
            ((_func_numeric_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr *)
             in_stack_fffffffffffffe28,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(var *)in_stack_fffffffffffffdf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"seek",&local_91);
  cs::make_cni<void(&)(std::shared_ptr<std::ostream>&,cs::numeric_const&)>
            ((_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_numeric_ptr
              *)in_stack_fffffffffffffe28,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(var *)in_stack_fffffffffffffdf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"seek_from",&local_c1);
  cs::make_cni<void(&)(std::shared_ptr<std::ostream>&,std::_Ios_Seekdir,cs::numeric_const&)>
            (in_stack_fffffffffffffe28,(bool)uVar3);
  func = cs::name_space::add_var
                   (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                    (var *)in_stack_fffffffffffffdf0);
  paVar2 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"flush",paVar2);
  uVar3 = (undefined1)((ulong)paVar2 >> 0x38);
  cs::make_cni<void(&)(std::shared_ptr<std::ostream>&)>
            ((_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr *)func,
             (bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(var *)in_stack_fffffffffffffdf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"good",&local_121);
  cs::make_cni<bool(&)(std::shared_ptr<std::ostream>const&)>
            ((_func_bool_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr *)func,
             (bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(var *)in_stack_fffffffffffffdf0);
  this = (name_space *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_151 + 1),"print",(allocator *)this);
  cs::make_cni<void(&)(std::shared_ptr<std::ostream>&,cs_impl::any_const&)>
            ((_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_any_ptr
              *)func,(bool)uVar3);
  name = (string *)
         cs::name_space::add_var(this,in_stack_fffffffffffffdf8,(var *)in_stack_fffffffffffffdf0);
  paVar2 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"println",paVar2);
  cs::make_cni<void(&)(std::shared_ptr<std::ostream>&,cs_impl::any_const&)>
            ((_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_any_ptr
              *)func,(bool)uVar3);
  cs::name_space::add_var(this,name,(var *)paVar2);
  any::~any((any *)0x267116);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  any::~any((any *)0x26713d);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  any::~any((any *)0x267164);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  any::~any((any *)0x26718b);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  any::~any((any *)0x2671b2);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  any::~any((any *)0x2671d9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  any::~any((any *)0x267200);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  any::~any((any *)0x267227);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			(*ostream_ext)
			.add_var("put", make_cni(put))
			.add_var("tell", make_cni(tell))
			.add_var("seek", make_cni(seek))
			.add_var("seek_from", make_cni(seek_from))
			.add_var("flush", make_cni(flush))
			.add_var("good", make_cni(good))
			.add_var("print", make_cni(print))
			.add_var("println", make_cni(println));
		}